

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O1

long __thiscall xz_rect::random(xz_rect *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  double *in_RDX;
  long in_RSI;
  
  dVar1 = *(double *)(in_RSI + 0x18);
  dVar2 = *(double *)(in_RSI + 0x20);
  iVar8 = rand();
  dVar3 = *(double *)(in_RSI + 0x38);
  dVar4 = *(double *)(in_RSI + 0x28);
  dVar5 = *(double *)(in_RSI + 0x30);
  iVar9 = rand();
  dVar6 = in_RDX[1];
  dVar7 = in_RDX[2];
  (this->super_hittable)._vptr_hittable =
       (_func_int **)(((double)iVar8 * 4.656612873077393e-10 * (dVar2 - dVar1) + dVar1) - *in_RDX);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(dVar3 - dVar6);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((double)iVar9 * 4.656612873077393e-10 * (dVar5 - dVar4) + dVar4) - dVar7);
  return (long)this;
}

Assistant:

virtual vec3 random(const vec3& origin) const override {
        auto random_point = vec3(random_double(x0,x1), k, random_double(z0,z1));
        return random_point - origin;
    }